

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_image::set_pixel(dxt_image *this,uint x,uint y,color_quad_u8 *c,bool perceptual)

{
  element *peVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  sbyte sVar11;
  uint uVar12;
  byte bVar13;
  uint y_00;
  dxt3_block *this_00;
  ushort packed_color5;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  uint byte_bit_ofs;
  color_quad_u8 colors [4];
  color_quad_u8 subblock_colors1 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_a8 [10];
  ulong local_80;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_78;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  element *local_50;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_48 [6];
  
  uVar12 = this->m_num_elements_per_block;
  uVar17 = (ulong)uVar12;
  if (uVar12 != 0) {
    this_00 = (dxt3_block *)(this->m_pElements + (this->m_blocks_x * (y >> 2) + (x >> 2)) * uVar12);
    uVar14 = x & 3;
    local_58 = (ulong)uVar14;
    y_00 = y & 3;
    uVar12 = uVar14 + y_00 * 4;
    local_60 = (ulong)uVar12;
    uVar12 = uVar12 * 3;
    bVar8 = (byte)uVar12 & 7;
    bVar9 = (byte)x * '\x02' & 6;
    local_68 = (ulong)(uVar12 >> 3);
    bVar10 = (byte)(3 << bVar9);
    local_70 = local_a8;
    if (y_00 == 3) {
      local_70 = local_48;
    }
    local_78 = local_a8;
    if (uVar14 == 3) {
      local_78 = local_48;
    }
    local_80 = (ulong)(uVar14 >> 1) ^ 7;
    sVar11 = (char)y_00 + ((byte)x & 1) * '\x04';
    bVar13 = ~(byte)(1 << sVar11);
    uVar20 = 0;
    do {
      switch(this->m_element_type[uVar20]) {
      case cColorDXT1:
        uVar5 = dxt1_block::get_block_colors
                          ((color_quad_u8 *)&local_a8[0].field_0,*(uint16 *)this_00->m_alpha,
                           *(uint16 *)(this_00->m_alpha + 2));
        if ((this->m_format == cDXT1A) && (-1 < (char)(c->field_0).field_0.a)) {
          this_00->m_alpha[(ulong)y_00 + 4] = this_00->m_alpha[(ulong)y_00 + 4] | bVar10;
        }
        else {
          if (uVar5 == 0) {
            iVar6 = 0;
          }
          else {
            uVar12 = 0xffffffff;
            uVar17 = 0;
            iVar6 = 0;
            do {
              iVar19 = (uint)local_a8[uVar17].field_0.r - (uint)(c->field_0).field_0.r;
              iVar22 = (uint)local_a8[uVar17].field_0.g - (uint)(c->field_0).field_0.g;
              iVar21 = (uint)local_a8[uVar17].field_0.b - (uint)(c->field_0).field_0.b;
              iVar18 = iVar19 * 8;
              iVar23 = iVar22 * 0x19;
              if (!perceptual) {
                iVar18 = iVar19;
                iVar23 = iVar22;
              }
              uVar14 = iVar21 * iVar21 + iVar18 * iVar19 + iVar23 * iVar22;
              bVar24 = uVar14 < uVar12;
              if (bVar24) {
                uVar12 = uVar14;
              }
              if (bVar24) {
                iVar6 = (int)uVar17;
              }
              uVar17 = uVar17 + 1;
            } while (uVar5 != uVar17);
          }
          this_00->m_alpha[(ulong)y_00 + 4] =
               (byte)(iVar6 << bVar9) | this_00->m_alpha[(ulong)y_00 + 4] & ~bVar10;
        }
        break;
      case cAlphaDXT3:
        dxt3_block::set_alpha
                  (this_00,(uint)local_58,y_00,
                   (uint)(c->field_0).c[(uint)(int)this->m_element_component_index[uVar20]],true);
        break;
      case cAlphaDXT5:
        dxt5_block::get_block_values
                  ((uint *)local_a8[0].c,(uint)this_00->m_alpha[0],(uint)this_00->m_alpha[1]);
        uVar12 = 0xffffffff;
        uVar16 = 0;
        uVar17 = 0;
        do {
          uVar15 = local_a8[uVar16].m_u32 -
                   (uint)(c->field_0).c[(uint)(int)this->m_element_component_index[uVar20]];
          uVar14 = -uVar15;
          if (0 < (int)uVar15) {
            uVar14 = uVar15;
          }
          if (uVar14 < uVar12) {
            uVar17 = uVar16 & 0xffffffff;
            uVar12 = uVar14;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != 8);
        if ((uint)local_60 < 0xe) {
          uVar12 = (int)uVar17 << bVar8 |
                   (uint)CONCAT11(this_00->m_alpha[local_68 + 3],this_00->m_alpha[local_68 + 2]) &
                   ~(7 << bVar8);
          this_00->m_alpha[local_68 + 3] = (uint8)(uVar12 >> 8);
        }
        else {
          uVar12 = (int)uVar17 << bVar8 | (uint)this_00->m_alpha[local_68 + 2] & ~(7 << bVar8);
        }
        this_00->m_alpha[local_68 + 2] = (uint8)uVar12;
        break;
      case cColorETC1:
        peVar1 = this->m_pElements +
                 ((int)uVar20 + (this->m_blocks_x * (y >> 2) + (x >> 2)) * (int)uVar17);
        bVar2 = peVar1->m_bytes[3];
        uVar14 = bVar2 >> 2 & 7;
        uVar12 = (uint)peVar1->m_bytes[0];
        local_50 = peVar1;
        if ((bVar2 & 2) == 0) {
          etc1_block::get_abs_subblock_colors
                    ((color_quad_u8 *)&local_a8[0].field_0,
                     (ushort)((uVar12 & 0xf0) << 4) |
                     (ushort)(peVar1->m_bytes[2] >> 4) | peVar1->m_bytes[1] & 0xfff0,
                     (uint)(bVar2 >> 5));
          etc1_block::get_abs_subblock_colors
                    ((color_quad_u8 *)&local_48[0].field_0,
                     (peVar1->m_bytes[0] & 0xf) << 8 |
                     (ushort)(byte)(peVar1->m_bytes[1] << 4) | peVar1->m_bytes[2] & 0xf,uVar14);
        }
        else {
          bVar3 = peVar1->m_bytes[1];
          bVar4 = peVar1->m_bytes[2];
          packed_color5 =
               (ushort)((uVar12 & 0xf8) << 7) | (ushort)(bVar4 >> 3) + (bVar3 & 0xfff8) * 4;
          etc1_block::get_diff_subblock_colors
                    ((color_quad_u8 *)&local_a8[0].field_0,packed_color5,(uint)(bVar2 >> 5));
          etc1_block::get_diff_subblock_colors
                    ((color_quad_u8 *)&local_48[0].field_0,packed_color5,
                     (ushort)((uVar12 & 7) << 6) | (bVar4 & 7) + (bVar3 & 7) * 8,uVar14);
        }
        paVar7 = local_70;
        if ((bVar2 & 1) == 0) {
          paVar7 = local_78;
        }
        uVar16 = 0;
        uVar12 = 0xffffffff;
        uVar17 = 0;
        do {
          iVar18 = (uint)paVar7[uVar16].field_0.r - (uint)(c->field_0).field_0.r;
          iVar19 = (uint)paVar7[uVar16].field_0.g - (uint)(c->field_0).field_0.g;
          iVar22 = (uint)paVar7[uVar16].field_0.b - (uint)(c->field_0).field_0.b;
          iVar23 = iVar18 * 8;
          iVar6 = iVar19 * 0x19;
          if (!perceptual) {
            iVar23 = iVar18;
            iVar6 = iVar19;
          }
          uVar14 = iVar22 * iVar22 + iVar23 * iVar18 + iVar6 * iVar19;
          if (uVar14 < uVar12) {
            uVar17 = uVar16 & 0xffffffff;
            uVar12 = uVar14;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != 4);
        bVar2 = (&g_selector_index_to_etc1)[uVar17];
        local_50->m_bytes[local_80] =
             (byte)((bVar2 & 1) << sVar11) | local_50->m_bytes[local_80] & bVar13;
        local_50->m_bytes[local_80 - 2] =
             (bVar2 >> 1) << sVar11 | local_50->m_bytes[local_80 - 2] & bVar13;
      }
      uVar20 = uVar20 + 1;
      this_00 = this_00 + 1;
      uVar17 = (ulong)this->m_num_elements_per_block;
    } while (uVar20 < uVar17);
  }
  return;
}

Assistant:

void dxt_image::set_pixel(uint x, uint y, const color_quad_u8& c, bool perceptual)
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        element* pElement = &get_element(block_x, block_y, 0);

        for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++)
        {
            switch (m_element_type[element_index])
            {
            case cColorETC1:
            {
                etc1_block& block = *reinterpret_cast<etc1_block*>(&get_element(block_x, block_y, element_index));

                const bool diff_flag = block.get_diff_bit();
                const bool flip_flag = block.get_flip_bit();
                const uint table_index0 = block.get_inten_table(0);
                const uint table_index1 = block.get_inten_table(1);
                color_quad_u8 subblock_colors0[4], subblock_colors1[4];

                if (diff_flag)
                {
                    const uint16 base_color5 = block.get_base5_color();
                    const uint16 delta_color3 = block.get_delta3_color();
                    etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
                    etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
                    const uint16 base_color4_1 = block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
                }

                const uint bx = x & 3;
                const uint by = y & 3;

                color_quad_u8* pColors = subblock_colors1;
                if (flip_flag)
                {
                    if (by <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }
                else
                {
                    if (bx <= 2)
                    {
                        pColors = subblock_colors0;
                    }
                }

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < 4; i++)
                {
                    uint error = color::color_distance(perceptual, pColors[i], c, false);
                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                block.set_selector(bx, by, best_selector);
                break;
            }
            case cColorDXT1:
            {
                dxt1_block* pDXT1_block = reinterpret_cast<dxt1_block*>(pElement);

                color_quad_u8 colors[cDXT1SelectorValues];
                const uint n = pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

                if ((m_format == cDXT1A) && (c.a < 128))
                {
                    pDXT1_block->set_selector(x & 3, y & 3, 3);
                }
                else
                {
                    uint best_error = UINT_MAX;
                    uint best_selector = 0;

                    for (uint i = 0; i < n; i++)
                    {
                        uint error = color::color_distance(perceptual, colors[i], c, false);
                        if (error < best_error)
                        {
                            best_error = error;
                            best_selector = i;
                        }
                    }

                    pDXT1_block->set_selector(x & 3, y & 3, best_selector);
                }

                break;
            }
            case cAlphaDXT5:
            {
                dxt5_block* pDXT5_block = reinterpret_cast<dxt5_block*>(pElement);

                uint values[cDXT5SelectorValues];
                dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

                const int comp_index = m_element_component_index[element_index];

                uint best_error = UINT_MAX;
                uint best_selector = 0;

                for (uint i = 0; i < cDXT5SelectorValues; i++)
                {
                    uint error = labs((int)values[i] - (int)c[comp_index]); // no need to square

                    if (error < best_error)
                    {
                        best_error = error;
                        best_selector = i;
                    }
                }

                pDXT5_block->set_selector(x & 3, y & 3, best_selector);

                break;
            }
            case cAlphaDXT3:
            {
                const int comp_index = m_element_component_index[element_index];

                dxt3_block* pDXT3_block = reinterpret_cast<dxt3_block*>(pElement);

                pDXT3_block->set_alpha(x & 3, y & 3, c[comp_index], true);

                break;
            }
            default:
                break;
            }
        } // element_index
    }